

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Byte * tt_cmap14_find_variant(FT_Byte *base,FT_UInt32 variantCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = *(uint *)base;
  uVar2 = 0;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  while( true ) {
    do {
      uVar1 = uVar3;
      if (uVar1 <= uVar2) {
        return (FT_Byte *)0x0;
      }
      uVar3 = uVar2 + uVar1 >> 1;
      uVar5 = (ulong)(uVar3 * 0xb);
      uVar4 = (uint)base[uVar5 + 6] | (uint)base[uVar5 + 5] << 8 | (uint)base[uVar5 + 4] << 0x10;
    } while (variantCode < uVar4);
    if (variantCode <= uVar4) break;
    uVar2 = uVar3 + 1;
    uVar3 = uVar1;
  }
  return base + uVar5 + 7;
}

Assistant:

static FT_Byte*
  tt_cmap14_find_variant( FT_Byte    *base,
                          FT_UInt32   variantCode )
  {
    FT_UInt32  numVar = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numVar;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid    = ( min + max ) >> 1;
      FT_Byte*   p      = base + 11 * mid;
      FT_ULong   varSel = TT_NEXT_UINT24( p );


      if ( variantCode < varSel )
        max = mid;
      else if ( variantCode > varSel )
        min = mid + 1;
      else
        return p;
    }

    return NULL;
  }